

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::resize
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this,size_t size)

{
  ArrayPtr<const_capnp::word> *location;
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *target;
  size_t size_local;
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this_local;
  
  sVar1 = capacity(this);
  if (sVar1 < size) {
    _::inlineRequireFailure
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/array.h"
               ,0x1ba,"size <= capacity()","\"can\'t resize past capacity\"",
               "can\'t resize past capacity");
  }
  pAVar2 = this->ptr + size;
  if (this->pos < pAVar2) {
    while (this->pos < pAVar2) {
      location = this->pos;
      this->pos = location + 1;
      ctor<kj::ArrayPtr<capnp::word_const>>(location);
    }
  }
  else {
    this->pos = pAVar2;
  }
  return;
}

Assistant:

void resize(size_t size) {
    KJ_IREQUIRE(size <= capacity(), "can't resize past capacity");

    T* target = ptr + size;
    if (target > pos) {
      // expand
      if (__has_trivial_constructor(T)) {
        pos = target;
      } else {
        while (pos < target) {
          kj::ctor(*pos++);
        }
      }
    } else {
      // truncate
      if (__has_trivial_destructor(T)) {
        pos = target;
      } else {
        while (pos > target) {
          kj::dtor(*--pos);
        }
      }
    }
  }